

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O3

int little2_scanAtts(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  byte bVar1;
  byte bVar2;
  bool bVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  byte *pbVar7;
  uint uVar8;
  byte bVar9;
  int iVar10;
  byte *local_50;
  char **local_48;
  char *local_40;
  char *local_38;
  
  uVar5 = (long)end - (long)ptr;
  if ((long)uVar5 < 2) {
    return -1;
  }
  local_38 = end + -4;
  local_40 = end + -6;
LAB_003e5ebc:
  bVar1 = ((byte *)ptr)[1];
  iVar4 = 0;
  pbVar7 = (byte *)ptr;
  local_48 = nextTokPtr;
  iVar10 = iVar4;
  if (bVar1 < 0xdc) {
    if (bVar1 != 0) {
      if (bVar1 - 0xd8 < 4) goto switchD_003e5ef2_caseD_7;
      goto switchD_003e5ef2_caseD_1d;
    }
    iVar10 = 0;
    switch(*(undefined1 *)((long)enc[1].scanners + (ulong)(byte)*ptr)) {
    case 6:
      iVar10 = iVar4;
      if (uVar5 == 2) {
        return -2;
      }
      break;
    case 7:
switchD_003e5ef2_caseD_7:
      iVar10 = iVar4;
      if (uVar5 < 4) {
        return -2;
      }
      break;
    case 9:
    case 10:
    case 0x15:
      ptr = (char *)((byte *)ptr + 2);
      lVar6 = (long)end - (long)ptr;
      while( true ) {
        if (lVar6 < 2) {
          return -1;
        }
        pbVar7 = (byte *)ptr;
        iVar10 = iVar4;
        if (((byte *)ptr)[1] != 0) goto switchD_003e5ef2_caseD_8;
        bVar1 = *(byte *)((long)enc[1].scanners + (ulong)(byte)*ptr);
        if ((1 < bVar1 - 9) && (bVar1 != 0x15)) break;
        ptr = (char *)((byte *)ptr + 2);
        lVar6 = lVar6 + -2;
      }
      if (bVar1 == 0xe) goto switchD_003e5ef2_caseD_e;
      break;
    case 0xe:
switchD_003e5ef2_caseD_e:
      local_50 = (byte *)ptr + 2;
      if ((long)end - (long)local_50 < 2) {
        return -1;
      }
      uVar5 = (long)local_38 - (long)ptr;
      while( true ) {
        if (local_50[1] != 0) goto switchD_003e60cf_caseD_0;
        bVar1 = *(byte *)((long)enc[1].scanners + (ulong)*local_50);
        if ((bVar1 & 0xfe) == 0xc) break;
        if ((0x15 < bVar1) || ((0x200600U >> (bVar1 & 0x1f) & 1) == 0))
        goto switchD_003e60cf_caseD_0;
        local_50 = local_50 + 2;
        bVar3 = (long)uVar5 < 2;
        uVar5 = uVar5 - 2;
        if (bVar3) {
          return -1;
        }
      }
      local_50 = local_50 + 2;
      if ((long)uVar5 < 2) {
        return -1;
      }
      do {
        bVar2 = local_50[1];
        if (bVar2 < 0xdc) {
          bVar9 = 7;
          if (3 < bVar2 - 0xd8) {
            if (bVar2 == 0) {
              bVar9 = *(byte *)((long)enc[1].scanners + (ulong)*local_50);
            }
            else {
LAB_003e60b3:
              bVar9 = 0x1d;
            }
          }
        }
        else if (bVar2 - 0xdc < 4) {
          bVar9 = 8;
        }
        else if ((bVar2 != 0xff) || (bVar9 = 0, *local_50 < 0xfe)) goto LAB_003e60b3;
        if (bVar9 == bVar1) goto LAB_003e6160;
        switch(bVar9) {
        case 0:
        case 1:
        case 2:
        case 8:
          goto switchD_003e60cf_caseD_0;
        case 3:
          iVar4 = little2_scanRef(enc,(char *)(local_50 + 2),end,(char **)&local_50);
          nextTokPtr = local_48;
          if (iVar4 < 1) {
            iVar10 = 0;
            pbVar7 = local_50;
            if (iVar4 != 0) {
              return iVar4;
            }
            goto switchD_003e5ef2_caseD_8;
          }
          break;
        default:
          local_50 = local_50 + 2;
          break;
        case 6:
          if (uVar5 == 2) {
            return -2;
          }
          local_50 = local_50 + 3;
          break;
        case 7:
          if (uVar5 < 4) {
            return -2;
          }
          local_50 = local_50 + 4;
        }
        uVar5 = (long)end - (long)local_50;
        if ((long)uVar5 < 2) {
          return -1;
        }
      } while( true );
    case 0x16:
    case 0x18:
    case 0x19:
    case 0x1a:
    case 0x1b:
      goto switchD_003e5ef2_caseD_16;
    case 0x1d:
      goto switchD_003e5ef2_caseD_1d;
    }
    goto switchD_003e5ef2_caseD_8;
  }
  if (bVar1 == 0xff) {
    if (0xfd < (byte)*ptr) goto switchD_003e5ef2_caseD_8;
  }
  else if (bVar1 - 0xdc < 4) goto switchD_003e5ef2_caseD_8;
switchD_003e5ef2_caseD_1d:
  bVar1 = "\x19\x03\x1a\x1b\x1c\x1d\x1e"[bVar1];
  goto LAB_003e5f7e;
switchD_003e60cf_caseD_0:
  ptr = (char *)local_50;
  goto LAB_003e624f;
LAB_003e6160:
  ptr = (char *)(local_50 + 2);
  if ((long)end - (long)ptr < 2) {
    return -1;
  }
  if (local_50[3] == 0) {
    bVar1 = *(byte *)((long)enc[1].scanners + (ulong)(byte)*ptr);
    iVar10 = 0;
    uVar8 = (uint)bVar1;
    pbVar7 = (byte *)ptr;
    local_48 = nextTokPtr;
    if (bVar1 < 0xb) {
      if (1 < uVar8 - 9) goto switchD_003e5ef2_caseD_8;
    }
    else if (bVar1 != 0x15) {
      if (uVar8 == 0xb) {
switchD_003e61f6_caseD_b:
        pbVar7 = (byte *)ptr + 2;
        iVar10 = 1;
      }
      else if (uVar8 == 0x11) {
switchD_003e61f6_caseD_11:
        pbVar7 = (byte *)ptr + 2;
        if ((long)end - (long)pbVar7 < 2) {
          return -1;
        }
        if (((byte *)ptr)[3] == 0) {
          if (((byte *)ptr)[2] == 0x3e) {
            pbVar7 = (byte *)ptr + 4;
          }
          iVar10 = (uint)(((byte *)ptr)[2] == 0x3e) * 3;
        }
      }
      goto switchD_003e5ef2_caseD_8;
    }
    ptr = (char *)(local_50 + 4);
    if ((long)end - (long)ptr < 2) {
      return -1;
    }
    lVar6 = (long)local_40 - (long)local_50;
    while (bVar1 = ((byte *)ptr)[1], pbVar7 = (byte *)ptr, bVar1 == 0) {
      switch(*(undefined1 *)((long)enc[1].scanners + (ulong)(byte)*ptr)) {
      case 6:
        if (lVar6 == 0) {
          return -2;
        }
        goto switchD_003e5ef2_caseD_8;
      case 7:
        goto switchD_003e61f6_caseD_7;
      default:
        goto switchD_003e5ef2_caseD_8;
      case 9:
      case 10:
      case 0x15:
        ptr = (char *)((byte *)ptr + 2);
        bVar3 = lVar6 < 2;
        lVar6 = lVar6 + -2;
        if (bVar3) {
          return -1;
        }
        break;
      case 0xb:
        goto switchD_003e61f6_caseD_b;
      case 0x11:
        goto switchD_003e61f6_caseD_11;
      case 0x16:
      case 0x18:
        goto switchD_003e5ef2_caseD_16;
      case 0x1d:
        goto switchD_003e61f6_caseD_1d;
      }
    }
    if (bVar1 - 0xd8 < 4) {
switchD_003e61f6_caseD_7:
      if (lVar6 + 2U < 4) {
        return -2;
      }
    }
    else if ((3 < bVar1 - 0xdc) && ((bVar1 != 0xff || ((byte)*ptr < 0xfe)))) {
switchD_003e61f6_caseD_1d:
      bVar1 = "\x02\x03\x04\x05\x06\a\b"[((byte *)ptr)[1]];
LAB_003e5f7e:
      pbVar7 = (byte *)ptr;
      local_48 = nextTokPtr;
      iVar10 = 0;
      if ((*(uint *)((long)namingBitmap + (ulong)((byte)*ptr >> 3 & 0x1c | (uint)bVar1 << 5)) >>
           ((byte)*ptr & 0x1f) & 1) != 0) {
switchD_003e5ef2_caseD_16:
        ptr = (char *)((byte *)ptr + 2);
        uVar5 = (long)end - (long)ptr;
        if ((long)uVar5 < 2) {
          return -1;
        }
        goto LAB_003e5ebc;
      }
    }
    goto switchD_003e5ef2_caseD_8;
  }
LAB_003e624f:
  pbVar7 = (byte *)ptr;
  local_48 = nextTokPtr;
  iVar10 = 0;
switchD_003e5ef2_caseD_8:
  *local_48 = (char *)pbVar7;
  return iVar10;
}

Assistant:

static int PTRCALL
PREFIX(scanAtts)(const ENCODING *enc, const char *ptr, const char *end,
                 const char **nextTokPtr)
{
#ifdef XML_NS
  int hadColon = 0;
#endif
  while (HAS_CHAR(enc, ptr, end)) {
    switch (BYTE_TYPE(enc, ptr)) {
    CHECK_NAME_CASES(enc, ptr, end, nextTokPtr)
#ifdef XML_NS
    case BT_COLON:
      if (hadColon) {
        *nextTokPtr = ptr;
        return XML_TOK_INVALID;
      }
      hadColon = 1;
      ptr += MINBPC(enc);
      REQUIRE_CHAR(enc, ptr, end);
      switch (BYTE_TYPE(enc, ptr)) {
      CHECK_NMSTRT_CASES(enc, ptr, end, nextTokPtr)
      default:
        *nextTokPtr = ptr;
        return XML_TOK_INVALID;
      }
      break;
#endif
    case BT_S: case BT_CR: case BT_LF:
      for (;;) {
        int t;

        ptr += MINBPC(enc);
        REQUIRE_CHAR(enc, ptr, end);
        t = BYTE_TYPE(enc, ptr);
        if (t == BT_EQUALS)
          break;
        switch (t) {
        case BT_S:
        case BT_LF:
        case BT_CR:
          break;
        default:
          *nextTokPtr = ptr;
          return XML_TOK_INVALID;
        }
      }
    /* fall through */
    case BT_EQUALS:
      {
        int open;
#ifdef XML_NS
        hadColon = 0;
#endif
        for (;;) {
          ptr += MINBPC(enc);
          REQUIRE_CHAR(enc, ptr, end);
          open = BYTE_TYPE(enc, ptr);
          if (open == BT_QUOT || open == BT_APOS)
            break;
          switch (open) {
          case BT_S:
          case BT_LF:
          case BT_CR:
            break;
          default:
            *nextTokPtr = ptr;
            return XML_TOK_INVALID;
          }
        }
        ptr += MINBPC(enc);
        /* in attribute value */
        for (;;) {
          int t;
          REQUIRE_CHAR(enc, ptr, end);
          t = BYTE_TYPE(enc, ptr);
          if (t == open)
            break;
          switch (t) {
          INVALID_CASES(ptr, nextTokPtr)
          case BT_AMP:
            {
              int tok = PREFIX(scanRef)(enc, ptr + MINBPC(enc), end, &ptr);
              if (tok <= 0) {
                if (tok == XML_TOK_INVALID)
                  *nextTokPtr = ptr;
                return tok;
              }
              break;
            }
          case BT_LT:
            *nextTokPtr = ptr;
            return XML_TOK_INVALID;
          default:
            ptr += MINBPC(enc);
            break;
          }
        }
        ptr += MINBPC(enc);
        REQUIRE_CHAR(enc, ptr, end);
        switch (BYTE_TYPE(enc, ptr)) {
        case BT_S:
        case BT_CR:
        case BT_LF:
          break;
        case BT_SOL:
          goto sol;
        case BT_GT:
          goto gt;
        default:
          *nextTokPtr = ptr;
          return XML_TOK_INVALID;
        }
        /* ptr points to closing quote */
        for (;;) {
          ptr += MINBPC(enc);
          REQUIRE_CHAR(enc, ptr, end);
          switch (BYTE_TYPE(enc, ptr)) {
          CHECK_NMSTRT_CASES(enc, ptr, end, nextTokPtr)
          case BT_S: case BT_CR: case BT_LF:
            continue;
          case BT_GT:
          gt:
            *nextTokPtr = ptr + MINBPC(enc);
            return XML_TOK_START_TAG_WITH_ATTS;
          case BT_SOL:
          sol:
            ptr += MINBPC(enc);
            REQUIRE_CHAR(enc, ptr, end);
            if (!CHAR_MATCHES(enc, ptr, ASCII_GT)) {
              *nextTokPtr = ptr;
              return XML_TOK_INVALID;
            }
            *nextTokPtr = ptr + MINBPC(enc);
            return XML_TOK_EMPTY_ELEMENT_WITH_ATTS;
          default:
            *nextTokPtr = ptr;
            return XML_TOK_INVALID;
          }
          break;
        }
        break;
      }
    default:
      *nextTokPtr = ptr;
      return XML_TOK_INVALID;
    }
  }
  return XML_TOK_PARTIAL;
}